

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  FKey *pList_00;
  int local_6c;
  FKey *pFStack_68;
  int j;
  ExprList_item *pItem;
  CollSeq *pColl;
  ExprList *pList;
  int local_48;
  int regAgg;
  int addrNext;
  int nArg;
  AggInfo_col *pC;
  AggInfo_func *pF;
  int local_28;
  int addrHitTest;
  int regHit;
  int i;
  Vdbe *v;
  AggInfo *pAggInfo_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  local_28 = 0;
  pF._4_4_ = 0;
  pAggInfo->directMode = '\x01';
  sqlite3ExprCacheClear(pParse);
  addrHitTest = 0;
  pC = (AggInfo_col *)pAggInfo->aFunc;
  for (; addrHitTest < pAggInfo->nFunc; addrHitTest = addrHitTest + 1) {
    local_48 = 0;
    pList_00 = pC->pTab->pFKey;
    if (pList_00 == (FKey *)0x0) {
      regAgg = 0;
      pList._4_4_ = 0;
    }
    else {
      regAgg = *(int *)&pList_00->pFrom;
      pList._4_4_ = sqlite3GetTempRange(pParse,regAgg);
      sqlite3ExprCodeExprList(pParse,(ExprList *)pList_00,pList._4_4_,1);
    }
    if (-1 < pC->iMem) {
      local_48 = sqlite3VdbeMakeLabel(p);
      codeDistinct(pParse,pC->iMem,local_48,1,pList._4_4_);
    }
    if ((*(byte *)(*(long *)&pC->iTable + 3) & 8) != 0) {
      pItem = (ExprList_item *)0x0;
      local_6c = 0;
      pFStack_68 = pList_00->pNextFrom;
      for (; pItem == (ExprList_item *)0x0 && local_6c < regAgg; local_6c = local_6c + 1) {
        pItem = (ExprList_item *)sqlite3ExprCollSeq(pParse,(Expr *)pFStack_68->pFrom);
        pFStack_68 = (FKey *)&pFStack_68->pPrevTo;
      }
      if (pItem == (ExprList_item *)0x0) {
        pItem = (ExprList_item *)pParse->db->pDfltColl;
      }
      if ((local_28 == 0) && (pAggInfo->nAccumulator != 0)) {
        local_28 = pParse->nMem + 1;
        pParse->nMem = local_28;
      }
      sqlite3VdbeAddOp4(p,0x11,local_28,0,0,(char *)pItem,-4);
    }
    sqlite3VdbeAddOp4(p,0x7b,0,pList._4_4_,pC->iSorterColumn,*(char **)&pC->iTable,-5);
    sqlite3VdbeChangeP5(p,(u8)regAgg);
    sqlite3ExprCacheAffinityChange(pParse,pList._4_4_,regAgg);
    sqlite3ReleaseTempRange(pParse,pList._4_4_,regAgg);
    if (local_48 != 0) {
      sqlite3VdbeResolveLabel(p,local_48);
      sqlite3ExprCacheClear(pParse);
    }
    pC = (AggInfo_col *)&pC->pExpr;
  }
  if (local_28 != 0) {
    pF._4_4_ = sqlite3VdbeAddOp1(p,0x1b,local_28);
  }
  sqlite3ExprCacheClear(pParse);
  addrHitTest = 0;
  _addrNext = pAggInfo->aCol;
  for (; addrHitTest < pAggInfo->nAccumulator; addrHitTest = addrHitTest + 1) {
    sqlite3ExprCode(pParse,_addrNext->pExpr,_addrNext->iMem);
    _addrNext = _addrNext + 1;
  }
  pAggInfo->directMode = '\0';
  sqlite3ExprCacheClear(pParse);
  if (pF._4_4_ != 0) {
    sqlite3VdbeJumpHere(p,pF._4_4_);
  }
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  sqlite3ExprCacheClear(pParse);
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 1);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(v);
      assert( nArg==1 );
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->flags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp4(v, OP_AggStep, 0, regAgg, pF->iMem,
                      (void*)pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ExprCacheAffinityChange(pParse, regAgg, nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
      sqlite3ExprCacheClear(pParse);
    }
  }

  /* Before populating the accumulator registers, clear the column cache.
  ** Otherwise, if any of the required column values are already present 
  ** in registers, sqlite3ExprCode() may use OP_SCopy to copy the value
  ** to pC->iMem. But by the time the value is used, the original register
  ** may have been used, invalidating the underlying buffer holding the
  ** text or blob value. See ticket [883034dcb5].
  **
  ** Another solution would be to change the OP_SCopy used to copy cached
  ** values to an OP_Copy.
  */
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit);
  }
  sqlite3ExprCacheClear(pParse);
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  sqlite3ExprCacheClear(pParse);
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}